

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_minotaur.cpp
# Opt level: O0

int AF_A_MinotaurChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  int iVar1;
  uint uVar2;
  AActor *pAVar3;
  bool bVar4;
  VMValue *local_d0;
  bool local_ba;
  bool local_b7;
  FSoundID local_b4;
  TFlags<ActorFlag,_unsigned_int> local_b0 [4];
  VMValue *local_a0;
  undefined1 local_98 [8];
  VMValue params [3];
  AActor *local_58;
  AMinotaurFriend *self1;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                  ,0x234,"int AF_A_MinotaurChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_b7 = true;
    if (stateowner != (AActor *)0x0) {
      local_b7 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_b7 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                    ,0x234,"int AF_A_MinotaurChase(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar4 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                      ,0x234,
                      "int AF_A_MinotaurChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_ba = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_ba = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_ba == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                      ,0x234,
                      "int AF_A_MinotaurChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar4 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                      ,0x234,
                      "int AF_A_MinotaurChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      self1 = (AMinotaurFriend *)pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      self1 = (AMinotaurFriend *)0x0;
    }
    bVar4 = DObject::IsKindOf((DObject *)stateowner,AMinotaurFriend::RegistrationInfo.MyClass);
    if (bVar4) {
      local_58 = stateowner;
      FRenderStyle::operator=((FRenderStyle *)&(stateowner->RenderStyle).field_0,STYLE_Normal);
      pAVar3 = local_58;
      if ((*(int *)&local_58->field_0x49c < 0) ||
         (level.maptime - *(int *)&local_58->field_0x49c < 0x36b)) {
        iVar1 = FRandom::operator()(&pr_minotaurchase);
        if (iVar1 < 0x1e) {
          local_a0 = (VMValue *)local_98;
          VMValue::VMValue(local_a0,(DObject *)local_58);
          local_a0 = (VMValue *)((long)&params[0].field_0 + 8);
          VMValue::VMValue(local_a0,(DObject *)local_58);
          local_a0 = (VMValue *)((long)&params[1].field_0 + 8);
          VMValue::VMValue(local_a0,(void *)0x0,8);
          VMFrameStack::Call((VMFrameStack *)param_local,&A_MinotaurLook_VMPtr->super_VMFunction,
                             (VMValue *)local_98,3,(VMReturn *)0x0,0,(VMException **)0x0);
          local_d0 = (VMValue *)((long)&params[2].field_0 + 8);
          do {
            local_d0 = local_d0 + -1;
            VMValue::~VMValue(local_d0);
          } while (local_d0 != (VMValue *)local_98);
        }
        pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&local_58->target);
        bVar4 = true;
        if (pAVar3 != (AActor *)0x0) {
          pAVar3 = TObjPtr<AActor>::operator->(&local_58->target);
          bVar4 = true;
          if (0 < pAVar3->health) {
            pAVar3 = TObjPtr<AActor>::operator->(&local_58->target);
            TFlags<ActorFlag,_unsigned_int>::operator&
                      (local_b0,(int)pAVar3 +
                                (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
            uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)local_b0);
            bVar4 = uVar2 == 0;
          }
        }
        if (bVar4) {
          AActor::SetIdle(local_58,false);
        }
        else {
          FaceMovementDirection(local_58);
          local_58->reactiontime = 0;
          if ((local_58->MeleeState == (FState *)0x0) ||
             (bVar4 = AActor::CheckMeleeRange(local_58), !bVar4)) {
            if ((local_58->MissileState == (FState *)0x0) ||
               (bVar4 = P_CheckMissileRange(local_58), !bVar4)) {
              bVar4 = P_Move(local_58);
              if (!bVar4) {
                P_NewChaseDir(local_58);
                FaceMovementDirection(local_58);
              }
              iVar1 = FRandom::operator()(&pr_minotaurchase);
              if (iVar1 < 6) {
                AActor::PlayActiveSound(local_58);
              }
            }
            else {
              AActor::SetState(local_58,local_58->MissileState,false);
            }
          }
          else {
            iVar1 = FSoundID::operator_cast_to_int(&(local_58->AttackSound).super_FSoundID);
            pAVar3 = local_58;
            if (iVar1 != 0) {
              FSoundID::FSoundID(&local_b4,&(local_58->AttackSound).super_FSoundID);
              S_Sound(pAVar3,1,&local_b4,1.0,1.0);
            }
            AActor::SetState(local_58,local_58->MeleeState,false);
          }
        }
      }
      else {
        FName::FName((FName *)&stack0xffffffffffffffa4,NAME_None);
        TAngle<double>::TAngle((TAngle<double> *)((long)&params[2].field_0 + 8),0.0);
        P_DamageMobj(pAVar3,(AActor *)0x0,(AActor *)0x0,1000000,(FName *)&stack0xffffffffffffffa4,0,
                     (DAngle *)((long)&params[2].field_0 + 8));
      }
    }
    else {
      A_Chase((VMFrameStack *)param_local,stateowner);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                ,0x234,"int AF_A_MinotaurChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MinotaurChase)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->IsKindOf(RUNTIME_CLASS(AMinotaurFriend)))
	{
		A_Chase (stack, self);
		return 0;
	}

	AMinotaurFriend *self1 = static_cast<AMinotaurFriend *> (self);

	// In case pain caused him to skip his fade in.
	self1->RenderStyle = STYLE_Normal;

	if (self1->StartTime >= 0 && (level.maptime - self1->StartTime) >= MAULATORTICS)
	{
		P_DamageMobj (self1, NULL, NULL, TELEFRAG_DAMAGE, NAME_None);
		return 0;
	}

	if (pr_minotaurchase() < 30)
		CALL_ACTION(A_MinotaurLook, self1);		// adjust to closest target

	if (!self1->target || (self1->target->health <= 0) ||
		!(self1->target->flags&MF_SHOOTABLE))
	{ // look for a new target
		self1->SetIdle();
		return 0;
	}

	FaceMovementDirection (self1);
	self1->reactiontime = 0;

	// Melee attack
	if (self1->MeleeState && self1->CheckMeleeRange ())
	{
		if (self1->AttackSound)
		{
			S_Sound (self1, CHAN_WEAPON, self1->AttackSound, 1, ATTN_NORM);
		}
		self1->SetState (self1->MeleeState);
		return 0;
	}

	// Missile attack
	if (self1->MissileState && P_CheckMissileRange(self1))
	{
		self1->SetState (self1->MissileState);
		return 0;
	}

	// chase towards target
	if (!P_Move (self1))
	{
		P_NewChaseDir (self1);
		FaceMovementDirection (self1);
	}

	// Active sound
	if (pr_minotaurchase() < 6)
	{
		self1->PlayActiveSound ();
	}
	return 0;
}